

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_00 [8];
  bool bVar2;
  Index bytes;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  Address AVar6;
  Literal *pLVar7;
  undefined4 extraout_var;
  int64_t iVar8;
  undefined1 local_2b8 [8];
  array<wasm::Literal,_16UL> lanes;
  Flow flow;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  Literal local_90;
  undefined1 local_78 [8];
  Literal vec;
  undefined1 local_48 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&lanes._M_elems[0xf].type,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x30));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo((MemoryInstanceInfo *)local_48,this,(Name)*(string_view *)(curr + 0x40));
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    AVar6 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_48,memory);
    this_00 = local_48;
    pLVar7 = Flow::getSingleValue((Flow *)&lanes._M_elems[0xf].type);
    ::wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar7);
    bytes = ::wasm::SIMDLoadStoreLane::getMemBytes();
    AVar6 = getFinalAddress<wasm::SIMDLoadStoreLane>
                      ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                       (Literal *)&flow.breakTo.super_IString.str._M_str,bytes,AVar6);
    ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_2b8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
               *(Expression **)(curr + 0x38));
    Flow::operator=((Flow *)&lanes._M_elems[0xf].type,(Flow *)local_2b8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_2b8);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar7 = Flow::getSingleValue((Flow *)&lanes._M_elems[0xf].type);
      ::wasm::Literal::Literal((Literal *)local_78,pLVar7);
      switch(*(undefined4 *)(curr + 0x10)) {
      case 0:
      case 4:
        ::wasm::Literal::getLanesUI8x16();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0xe])
                            (*(ExternalInterface **)((long)local_48 + 0x288),AVar6.addr,
                             info.instance,info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar3) & 0xffffffff000000ff;
          ::wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          ::wasm::Literal::~Literal((Literal *)&vec.type);
          ::wasm::Literal::Literal(&local_d8,(array *)local_2b8);
          Flow::Flow(__return_storage_ptr__,&local_d8);
          ::wasm::Literal::~Literal(&local_d8);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_48 + 0x288);
          iVar5 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar6.addr,(ulong)(uint)(int)(char)iVar5,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_2b8);
        break;
      case 1:
      case 5:
        ::wasm::Literal::getLanesUI16x8();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x10]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar3) & 0xffffffff0000ffff;
          ::wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          ::wasm::Literal::~Literal((Literal *)&vec.type);
          ::wasm::Literal::Literal(&local_c0,(array *)local_2b8);
          Flow::Flow(__return_storage_ptr__,&local_c0);
          ::wasm::Literal::~Literal(&local_c0);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_48 + 0x288);
          iVar5 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x17])
                    (pEVar1,AVar6.addr,(ulong)(uint)(int)(short)iVar5,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_2b8);
        break;
      case 2:
      case 6:
        ::wasm::Literal::getLanesI32x4();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x12]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = iVar3;
          ::wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          ::wasm::Literal::~Literal((Literal *)&vec.type);
          ::wasm::Literal::Literal(&local_a8,(array *)local_2b8);
          Flow::Flow(__return_storage_ptr__,&local_a8);
          ::wasm::Literal::~Literal(&local_a8);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_48 + 0x288);
          uVar4 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x18])
                    (pEVar1,AVar6.addr,(ulong)uVar4,info.instance,info.name.super_IString.str._M_len
                    );
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_2b8);
        break;
      case 3:
      case 7:
        ::wasm::Literal::getLanesI64x2();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x14]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(extraout_var,iVar3);
          ::wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          ::wasm::Literal::~Literal((Literal *)&vec.type);
          ::wasm::Literal::Literal(&local_90,(array *)local_2b8);
          Flow::Flow(__return_storage_ptr__,&local_90);
          ::wasm::Literal::~Literal(&local_90);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_48 + 0x288);
          iVar8 = Literal::geti64((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x19])
                    (pEVar1,AVar6.addr,iVar8,info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_2b8);
        break;
      default:
        ::wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0xd3b);
      }
      ::wasm::Literal::~Literal((Literal *)local_78);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&lanes._M_elems[0xf].type);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&lanes._M_elems[0xf].type);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&lanes._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }